

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,char *filename)

{
  REF_FILEPOS RVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  __off_t _Var5;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  REF_GLOB RStack_540;
  REF_BOOL verbose;
  REF_LONG ncell;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS local_50;
  REF_FILEPOS next_position;
  undefined1 local_40 [4];
  REF_BOOL available;
  REF_INT dim;
  REF_INT version;
  FILE *file;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  file = (FILE *)ref_grid->node;
  local_50 = -1;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)ref_grid;
  sVar4 = strlen(filename);
  iVar2 = strcmp((char *)((long)ref_mpi + (sVar4 - 6)),".meshb");
  if (iVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3f5,
           "ref_part_cad_discrete_edge",3,"expected .meshb extension");
    return 3;
  }
  _dim = (FILE *)0x0;
  if (ref_node->max == 0) {
    uVar3 = ref_import_meshb_header((char *)ref_mpi,&available,&ncell);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3f9,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"header");
      return uVar3;
    }
    _dim = fopen((char *)ref_mpi,"r");
    if (_dim == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_dim == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3fe,
             "ref_part_cad_discrete_edge","unable to open file");
      return 2;
    }
    uVar3 = ref_import_meshb_jump
                      ((FILE *)_dim,available,&ncell,3,(REF_BOOL *)((long)&next_position + 4),
                       &local_50);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x401,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"jump");
      return uVar3;
    }
    if (next_position._4_4_ == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x402,
             "ref_part_cad_discrete_edge","meshb missing dimension");
      return 1;
    }
    sVar4 = fread(local_40,4,1,_dim);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x403,
             "ref_part_cad_discrete_edge","dim",1,sVar4);
      return 1;
    }
  }
  uVar3 = ref_mpi_bcast((REF_MPI)ref_node,&available,1,1);
  if (uVar3 == 0) {
    uVar3 = ref_cell_free(*(REF_CELL *)(filename_local + 0x10));
    if (uVar3 == 0) {
      uVar3 = ref_cell_create((REF_CELL *)(filename_local + 0x10),REF_CELL_EDG);
      if (uVar3 == 0) {
        if (*(int *)(*(long *)filename_local + 4) == 0) {
          uVar3 = ref_import_meshb_jump
                            ((FILE *)_dim,available,&ncell,5,(REF_BOOL *)((long)&next_position + 4),
                             &local_50);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x40e,"ref_part_cad_discrete_edge",(ulong)uVar3,"jump");
            return uVar3;
          }
          if ((next_position._4_4_ != 0) &&
             (uVar3 = ref_part_meshb_long((FILE *)_dim,available,&stack0xfffffffffffffac0),
             uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x410,"ref_part_cad_discrete_edge",(ulong)uVar3,"ncell");
            return uVar3;
          }
        }
        uVar3 = ref_mpi_bcast((REF_MPI)ref_node,(void *)((long)&next_position + 4),1,1);
        if (uVar3 == 0) {
          if (next_position._4_4_ == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x416,"ref_part_cad_discrete_edge","no edge available in meshb");
            ref_grid_local._4_4_ = 1;
          }
          else {
            uVar3 = ref_mpi_bcast((REF_MPI)ref_node,&stack0xfffffffffffffac0,1,2);
            if (uVar3 == 0) {
              uVar3 = ref_part_meshb_cell_bcast
                                (*(REF_CELL *)(filename_local + 0x10),RStack_540,(REF_NODE)file,
                                 available,(FILE *)_dim);
              RVar1 = local_50;
              if (uVar3 == 0) {
                if (*(int *)(*(long *)filename_local + 4) == 0) {
                  _Var5 = ftello(_dim);
                  if (RVar1 != _Var5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x41f,"ref_part_cad_discrete_edge","end location",RVar1,_Var5);
                    return 1;
                  }
                  fclose(_dim);
                }
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x41c,"ref_part_cad_discrete_edge",(ulong)uVar3,"part cell");
                ref_grid_local._4_4_ = uVar3;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x418,"ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
              ref_grid_local._4_4_ = uVar3;
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x414,"ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
          ref_grid_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x409,"ref_part_cad_discrete_edge",(ulong)uVar3,"edg");
        ref_grid_local._4_4_ = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x408,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"clear out edge");
      ref_grid_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x406,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_LONG ncell;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "clear out edge");
  RSS(ref_cell_create(&ref_grid_edg(ref_grid), REF_CELL_EDG), "edg");

  if (ref_grid_once(ref_grid)) {
    RSS(ref_import_meshb_jump(file, version, key_pos, 5, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_long(file, version, &ncell), "ncell");
      if (verbose) printf("nedge %ld\n", ncell);
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "no edge available in meshb");

  RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_GLOB_TYPE), "bcast");

  RSS(ref_part_meshb_cell_bcast(ref_grid_edg(ref_grid), ncell, ref_node,
                                version, file),
      "part cell");

  if (ref_grid_once(ref_grid)) {
    REIS(next_position, ftello(file), "end location");
    fclose(file);
  }

  return REF_SUCCESS;
}